

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.h
# Opt level: O0

uchar re2c::Skeleton::rule2key<unsigned_char>(rule_rank_t r)

{
  bool bVar1;
  uchar uVar2;
  uint32_t uVar3;
  rule_rank_t local_10;
  uchar k;
  rule_rank_t r_local;
  
  local_10.value = r.value;
  bVar1 = rule_rank_t::is_none(&local_10);
  if (bVar1) {
    k = std::numeric_limits<unsigned_char>::max();
  }
  else {
    bVar1 = rule_rank_t::is_def(&local_10);
    if (bVar1) {
      uVar2 = std::numeric_limits<unsigned_char>::max();
      k = uVar2 + 0xff;
    }
    else {
      uVar3 = rule_rank_t::uint32(&local_10);
      k = (uchar)uVar3;
    }
  }
  return k;
}

Assistant:

key_t Skeleton::rule2key (rule_rank_t r)
{
	if (r.is_none()) {
		return std::numeric_limits<key_t>::max();
	} else if (r.is_def()) {
		key_t k = std::numeric_limits<key_t>::max();
		return --k;
	} else {
		return static_cast<key_t>(r.uint32());
	}
}